

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  ImGuiContext *g;
  
  ImVector<ImGuiContextHook>::push_back(&ctx->Hooks,hook);
  return;
}

Assistant:

void ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL);
    g.Hooks.push_back(*hook);
}